

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyMarkArena(Recycler *this,ArenaData *alloc)

{
  BigBlock *pBVar1;
  ArenaMemoryBlock *memoryBlocks;
  ArenaData *alloc_local;
  Recycler *this_local;
  
  pBVar1 = ArenaData::GetBigBlocks(alloc,false);
  VerifyMarkBigBlockList(this,pBVar1);
  pBVar1 = ArenaData::GetFullBlocks(alloc);
  VerifyMarkBigBlockList(this,pBVar1);
  memoryBlocks = ArenaData::GetMemoryBlocks(alloc);
  VerifyMarkArenaMemoryBlockList(this,memoryBlocks);
  return;
}

Assistant:

void
Recycler::VerifyMarkArena(ArenaData * alloc)
{
    VerifyMarkBigBlockList(alloc->GetBigBlocks(false));
    VerifyMarkBigBlockList(alloc->GetFullBlocks());
    VerifyMarkArenaMemoryBlockList(alloc->GetMemoryBlocks());
}